

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::rc::Texture3D::sample4(Texture3D *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  undefined8 uVar1;
  ConstPixelBufferAccess *pCVar2;
  tcu *ptVar3;
  tcu *ptVar4;
  float *pfVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  Vec3 dFdy1;
  float local_88;
  float fStack_84;
  tcu local_70 [12];
  tcu local_64 [12];
  tcu local_58 [12];
  undefined1 local_4c [28];
  
  if ((this->m_view).m_numLevels < 1) {
    local_88 = 0.0;
    fStack_84 = 0.0;
    fVar9 = 0.0;
  }
  else {
    pCVar2 = (this->m_view).m_levels;
    uVar1 = *(undefined8 *)(pCVar2->m_size).m_data;
    local_88 = (float)(int)uVar1;
    fStack_84 = (float)(int)((ulong)uVar1 >> 0x20);
    fVar9 = (float)(pCVar2->m_size).m_data[2];
  }
  tcu::operator-(local_58,packetTexcoords + 1,packetTexcoords);
  tcu::operator-(local_64,packetTexcoords + 3,packetTexcoords + 2);
  tcu::operator-(local_70,packetTexcoords + 2,packetTexcoords);
  tcu::operator-((tcu *)(local_4c + 0x10),packetTexcoords + 3,packetTexcoords + 1);
  pfVar5 = packetTexcoords->m_data + 2;
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    ptVar3 = local_64;
    if (uVar6 < 2) {
      ptVar3 = local_58;
    }
    ptVar4 = (tcu *)(local_4c + 0x10);
    if ((uVar6 & 1) == 0) {
      ptVar4 = local_70;
    }
    fVar10 = *(float *)(ptVar3 + 8);
    fVar12 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar12 = fVar10;
    }
    fVar10 = *(float *)(ptVar4 + 8);
    fVar15 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar15 = fVar10;
    }
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)ptVar3;
    auVar13._0_8_ = *(ulong *)ptVar3 ^ 0x8000000080000000;
    auVar13._8_4_ = 0x80000000;
    auVar13._12_4_ = 0x80000000;
    auVar14 = maxps(auVar13,auVar14);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)ptVar4;
    auVar16._0_8_ = *(ulong *)ptVar4 ^ 0x8000000080000000;
    auVar16._8_4_ = 0x80000000;
    auVar16._12_4_ = 0x80000000;
    auVar17 = maxps(auVar16,auVar17);
    uVar7 = -(uint)(auVar17._0_4_ <= auVar14._0_4_);
    uVar8 = -(uint)(auVar17._4_4_ <= auVar14._4_4_);
    fVar10 = (float)(~uVar7 & (uint)auVar17._0_4_ | (uint)auVar14._0_4_ & uVar7) * local_88;
    fVar11 = (float)(~uVar8 & (uint)auVar17._4_4_ | (uint)auVar14._4_4_ & uVar8) * fStack_84;
    uVar7 = -(uint)(fVar11 <= fVar10);
    fVar11 = (float)(~uVar7 & (uint)fVar11 | (uint)fVar10 & uVar7);
    fVar10 = (float)(~-(uint)(fVar15 <= fVar12) & (uint)fVar15 |
                    (uint)fVar12 & -(uint)(fVar15 <= fVar12)) * fVar9;
    uVar7 = -(uint)(fVar10 <= fVar11);
    fVar10 = deFloatLog2((float)(~uVar7 & (uint)fVar10 | uVar7 & (uint)fVar11));
    sample((Texture3D *)local_4c,((Vec3 *)(pfVar5 + -2))->m_data[0],pfVar5[-1],*pfVar5,
           fVar10 + lodBias);
    *(undefined8 *)output->m_data = local_4c._0_8_;
    *(undefined8 *)(output->m_data + 2) = local_4c._8_8_;
    output = output + 1;
    pfVar5 = pfVar5 + 3;
  }
  return;
}

Assistant:

void Texture3D::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();
	const float texDepth  = (float)m_view.getDepth();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float mw = de::max(de::abs(dFdx.z()), de::abs(dFdy.z()));
		const float p = de::max(de::max(mu * texWidth, mv * texHeight), mw * texDepth);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}